

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          ReferenceVars *type_vars,Index binding_index_offset)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  string name;
  Location loc;
  Var type;
  string local_160;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *local_140;
  ReferenceVar local_138;
  ulong local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Var local_c0;
  Var local_78;
  
  local_140 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)bindings;
  do {
    bVar3 = MatchLpar(this,token);
    if (!bVar3) {
      return (Result)Ok;
    }
    TVar4 = Peek(this,0);
    if (TVar4 == Last_String) {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      local_160._M_string_length = 0;
      local_160.field_2._M_local_buf[0] = '\0';
      Var::Var(&local_c0);
      GetToken((Token *)&local_138,this);
      uStack_e0 = CONCAT44(local_138.var.loc.filename._M_len._4_4_,
                           (undefined4)local_138.var.loc.filename._M_len);
      local_d8 = CONCAT44(local_138.var.loc.filename._M_str._4_4_,
                          local_138.var.loc.filename._M_str._0_4_);
      uStack_d0 = CONCAT44(local_138.var.loc.field_1._4_4_,local_138.var.loc.field_1.field_0.line);
      local_e8 = local_138._0_8_;
      ParseBindVarOpt(this,&local_160);
      RVar5 = ParseValueType(this,&local_c0);
      if (RVar5.enum_ != Error) {
        local_138.var.loc.field_1.field_0.last_column =
             (int)((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) +
             binding_index_offset;
        local_138.var.loc.filename._M_str._0_4_ = (undefined4)local_d8;
        local_138.var.loc.filename._M_str._4_4_ = local_d8._4_4_;
        local_138.var.loc.field_1.field_0.line = (int)uStack_d0;
        local_138.var.loc.field_1._4_4_ = uStack_d0._4_4_;
        local_138.index = (uint32_t)local_e8;
        local_138._4_4_ = local_e8._4_4_;
        local_138.var.loc.filename._M_len._0_4_ = (undefined4)uStack_e0;
        local_138.var.loc.filename._M_len._4_4_ = uStack_e0._4_4_;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                    *)bindings,0,&local_160,&local_138);
        if (local_c0.type_ == Name) {
          if ((this->options_->features).function_references_enabled_ == false) {
            __assert_fail("options_->features.function_references_enabled()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                          ,0x80f,
                          "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, ReferenceVars *, Index)"
                         );
          }
          pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          Var::Var(&local_78,&local_c0);
          local_138.index = (uint32_t)((ulong)((long)pTVar1 - (long)pTVar2) >> 3);
          Var::Var(&local_138.var,&local_78);
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          emplace_back<wabt::WastParser::ReferenceVar>(type_vars,&local_138);
          Var::~Var(&local_138.var);
          Var::~Var(&local_78);
          local_138._0_8_ = 0xffffffffffffffeb;
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                    (types,(Type *)&local_138);
          bindings = (BindingHash *)local_140;
        }
        else {
          if (local_c0.type_ != Index) {
            __assert_fail("type.is_name()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                          ,0x80e,
                          "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, ReferenceVars *, Index)"
                         );
          }
          local_138._4_4_ = 0;
          local_138.index = local_c0.field_2.index_;
          if (local_c0.field_2.index_ == 0xffffffeb) {
            __assert_fail("!EnumIsReferenceWithIndex(enum_)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                          ,0x40,"wabt::Type::Type(int32_t)");
          }
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                    (types,(Type *)&local_138);
        }
      }
      Var::~Var(&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,
                        CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                 local_160.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      RVar5 = ParseValueTypeList(this,types,type_vars);
    }
    if ((RVar5.enum_ == Error) || (RVar5 = Expect(this,Rpar), RVar5.enum_ == Error)) {
      return (Result)Error;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           ReferenceVars* type_vars,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Var type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      if (type.is_index()) {
        types->push_back(Type(type.index()));
      } else {
        assert(type.is_name());
        assert(options_->features.function_references_enabled());
        type_vars->push_back(ReferenceVar(types->size(), type));
        types->push_back(Type(Type::Reference, kInvalidIndex));
      }
    } else {
      CHECK_RESULT(ParseValueTypeList(types, type_vars));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}